

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi_is_hdr_from_callbacks(stbi_io_callbacks *clbk,void *user)

{
  int iVar1;
  undefined1 local_f0 [8];
  stbi__context s;
  
  s.io.skip = (_func_void_void_ptr_int *)clbk->eof;
  s._184_8_ = &s.read_from_callbacks;
  s._8_8_ = clbk->read;
  s.io.read = (_func_int_void_ptr_char_ptr_int *)clbk->skip;
  s.io_user_data = (void *)0x8000000001;
  s.buffer_start[0x78] = '\0';
  s.buffer_start[0x79] = '\0';
  s.buffer_start[0x7a] = '\0';
  s.buffer_start[0x7b] = '\0';
  s.io.eof = (_func_int_void_ptr *)user;
  s.img_buffer_end = (stbi_uc *)s._184_8_;
  stbi__refill_buffer((stbi__context *)local_f0);
  s.img_buffer_original = s.img_buffer;
  iVar1 = stbi__hdr_test((stbi__context *)local_f0);
  return iVar1;
}

Assistant:

STBIDEF int      stbi_is_hdr_from_callbacks(stbi_io_callbacks const *clbk, void *user)
{
   #ifndef STBI_NO_HDR
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *) clbk, user);
   return stbi__hdr_test(&s);
   #else
   STBI_NOTUSED(clbk);
   STBI_NOTUSED(user);
   return 0;
   #endif
}